

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::add_global_no_throw
          (Dispatch_Engine *this,Boxed_Value *obj,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  _Base_ptr p_Var3;
  long *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_bool>
  pVar4;
  Boxed_Value BVar5;
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  unique_lock<std::shared_mutex> local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  local_58;
  
  local_68._M_owns = false;
  local_68._M_device = (mutex_type *)obj;
  std::unique_lock<std::shared_mutex>::lock(&local_68);
  local_68._M_owns = true;
  paVar1 = &local_58.first.field_2;
  psVar2 = (size_type *)(in_RCX + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*in_RCX ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_58.first.field_2._M_allocated_capacity = *psVar2;
    local_58.first.field_2._8_8_ = in_RCX[3];
    local_58.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_58.first.field_2._M_allocated_capacity = *psVar2;
    local_58.first._M_dataplus._M_p = (pointer)*in_RCX;
  }
  local_58.first._M_string_length = in_RCX[1];
  *in_RCX = (long)psVar2;
  in_RCX[1] = 0;
  *(undefined1 *)(in_RCX + 2) = 0;
  local_58.second.m_data.
  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(name->_M_dataplus)._M_p;
  local_58.second.m_data.
  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name->_M_string_length;
  name->_M_string_length = 0;
  (name->_M_dataplus)._M_p = (pointer)0x0;
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                      *)(obj + 0x16),&local_58);
  (this->m_mutex)._M_impl._M_rwlock.__align = *(long *)(pVar4.first._M_node._M_node + 2);
  p_Var3 = pVar4.first._M_node._M_node[2]._M_parent;
  *(_Base_ptr *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = p_Var3;
  if (p_Var3 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
    }
  }
  if (local_58.second.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.second.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_68);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value add_global_no_throw(Boxed_Value obj, std::string name) {
        chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        return m_state.m_global_objects.insert(std::pair{std::move(name), std::move(obj)}).first->second;
      }